

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPair.c
# Opt level: O0

uint Fxu_PairHashKey(Fxu_Matrix *p,Fxu_Cube *pCube1,Fxu_Cube *pCube2,int *pnBase,int *pnLits1,
                    int *pnLits2)

{
  uint uVar1;
  uint local_64;
  Fxu_Lit *pFStack_60;
  uint Key;
  Fxu_Lit *pLit2;
  Fxu_Lit *pLit1;
  int local_48;
  int nLits2;
  int nLits1;
  int nBase;
  int Offset2;
  int Offset1;
  int *pnLits2_local;
  int *pnLits1_local;
  int *pnBase_local;
  Fxu_Cube *pCube2_local;
  Fxu_Cube *pCube1_local;
  Fxu_Matrix *p_local;
  
  local_64 = 0;
  local_48 = 0;
  pLit1._4_4_ = 0;
  nLits2 = 0;
  pLit2 = (pCube1->lLits).pHead;
  pFStack_60 = (pCube2->lLits).pHead;
  do {
    while ((pLit2 != (Fxu_Lit *)0x0 && (pFStack_60 != (Fxu_Lit *)0x0))) {
      if (pLit2->iVar == pFStack_60->iVar) {
        pLit2 = pLit2->pHNext;
        pFStack_60 = pFStack_60->pHNext;
        nLits2 = nLits2 + 1;
      }
      else {
        if (pLit2->iVar < pFStack_60->iVar) {
          uVar1 = s_Primes[local_48 + 100] * pLit2->iVar;
          pLit2 = pLit2->pHNext;
          local_48 = local_48 + 1;
        }
        else {
          uVar1 = s_Primes[pLit1._4_4_ + 200] * pFStack_60->iVar;
          pFStack_60 = pFStack_60->pHNext;
          pLit1._4_4_ = pLit1._4_4_ + 1;
        }
        local_64 = uVar1 ^ local_64;
      }
    }
    if ((pLit2 == (Fxu_Lit *)0x0) || (pFStack_60 != (Fxu_Lit *)0x0)) {
      if ((pLit2 != (Fxu_Lit *)0x0) || (pFStack_60 == (Fxu_Lit *)0x0)) {
        *pnBase = nLits2;
        *pnLits1 = local_48;
        *pnLits2 = pLit1._4_4_;
        return local_64;
      }
      uVar1 = s_Primes[pLit1._4_4_ + 200] * pFStack_60->iVar;
      pFStack_60 = pFStack_60->pHNext;
      pLit1._4_4_ = pLit1._4_4_ + 1;
    }
    else {
      uVar1 = s_Primes[local_48 + 100] * pLit2->iVar;
      pLit2 = pLit2->pHNext;
      local_48 = local_48 + 1;
    }
    local_64 = uVar1 ^ local_64;
  } while( true );
}

Assistant:

unsigned Fxu_PairHashKey( Fxu_Matrix * p, Fxu_Cube * pCube1, Fxu_Cube * pCube2, 
                         int * pnBase, int * pnLits1, int * pnLits2 )
{
    int Offset1 = 100, Offset2 = 200;
    int nBase, nLits1, nLits2;
    Fxu_Lit * pLit1, * pLit2;
    unsigned Key;

    // compute the hash key
    Key    = 0;
    nLits1 = 0;
    nLits2 = 0;
    nBase  = 0;
    pLit1  = pCube1->lLits.pHead;
    pLit2  = pCube2->lLits.pHead;
    while ( 1 )
    {
        if ( pLit1 && pLit2 )
        {
            if ( pLit1->iVar == pLit2->iVar )
            { // ensure cube-free
                pLit1 = pLit1->pHNext;
                pLit2 = pLit2->pHNext;
                // add this literal to the base
                nBase++;
            }
            else if ( pLit1->iVar < pLit2->iVar )
            {
                Key  ^= s_Primes[Offset1+nLits1] * pLit1->iVar;
                pLit1 = pLit1->pHNext;
                nLits1++;
            }
            else
            {
                Key  ^= s_Primes[Offset2+nLits2] * pLit2->iVar;
                pLit2 = pLit2->pHNext;
                nLits2++;
            }
        }
        else if ( pLit1 && !pLit2 )
        {
            Key  ^= s_Primes[Offset1+nLits1] * pLit1->iVar;
            pLit1 = pLit1->pHNext;
            nLits1++;
        }
        else if ( !pLit1 && pLit2 )
        {
            Key  ^= s_Primes[Offset2+nLits2] * pLit2->iVar;
            pLit2 = pLit2->pHNext;
            nLits2++;
        }
        else
            break;
    }
    *pnBase  = nBase;
    *pnLits1 = nLits1;
    *pnLits2 = nLits2;
    return Key;
}